

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  _Alloc_hider _Var1;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> MStack_48;
  char *local_38;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  int i_con_local;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_18;
  
  jw.kind_ = Unset;
  jw.n_written_ = 0;
  jw.wrt_ = wrt;
  i_con_local = i_con;
  local_38 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  key._M_str = (char *)0x8;
  key._M_len = (size_t)&jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&MStack_48,key);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
             &local_38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&MStack_48);
  key_00._M_str = (char *)0x5;
  key_00._M_len = (size_t)&jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&MStack_48,key_00);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
             &i_con_local);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&MStack_48);
  _Var1._M_p = (cnt->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_.
               _M_dataplus._M_p;
  if (*_Var1._M_p != '\0') {
    key_01._M_str = (char *)0x4;
    key_01._M_len = (size_t)&jw;
    local_38 = _Var1._M_p;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&MStack_48,key_01);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
               &local_38);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              (&MStack_48);
  }
  local_38 = (char *)CONCAT44(local_38._4_4_,cnt->depth_);
  key_02._M_str = (char *)0x5;
  key_02._M_len = (size_t)&jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&MStack_48,key_02);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
             (int *)&local_38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&MStack_48);
  key_03._M_str = (char *)0x4;
  key_03._M_len = (size_t)&jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_18,key_03)
  ;
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CoshId>
            (&local_18,
             (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>
              *)cnt);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_18);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&jw);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }